

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O0

int Sfm_LibImplementGatesArea
              (Sfm_Lib_t *p,int *pFanins,int nFanins,int iObj,Vec_Int_t *vGates,Vec_Wec_t *vFanins)

{
  Sfm_Fun_t *pSVar1;
  int iVar2;
  Mio_Library_t *pLib_00;
  Mio_Cell2_t *pMVar3;
  Mio_Cell2_t *pMVar4;
  Mio_Gate_t *pMVar5;
  Vec_Int_t *pVVar6;
  int local_6c;
  int i;
  Vec_Int_t *vLevel;
  Mio_Gate_t *pGate;
  Mio_Cell2_t *pCellT;
  Mio_Cell2_t *pCellB;
  Sfm_Fun_t *pObjMin;
  Mio_Library_t *pLib;
  Vec_Wec_t *vFanins_local;
  Vec_Int_t *vGates_local;
  int iObj_local;
  int nFanins_local;
  int *pFanins_local;
  Sfm_Lib_t *p_local;
  
  pLib_00 = (Mio_Library_t *)Abc_FrameReadLibGen();
  pSVar1 = p->pObjs;
  pMVar3 = p->pCells + (int)pSVar1[iObj].pFansB[0];
  pMVar4 = p->pCells + (int)pSVar1[iObj].pFansT[0];
  pMVar5 = Mio_LibraryReadGateByName(pLib_00,pMVar3->pName,(char *)0x0);
  if (pMVar5 != (Mio_Gate_t *)pMVar3->pMioGate) {
    __assert_fail("pGate == pCellB->pMioGate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                  ,0x2cd,
                  "int Sfm_LibImplementGatesArea(Sfm_Lib_t *, int *, int, int, Vec_Int_t *, Vec_Wec_t *)"
                 );
  }
  iVar2 = Mio_GateReadValue(pMVar5);
  Vec_IntPush(vGates,iVar2);
  pVVar6 = Vec_WecPushLevel(vFanins);
  for (local_6c = 0; local_6c < (int)(*(uint *)&pMVar3->field_0x10 >> 0x1c); local_6c = local_6c + 1
      ) {
    Vec_IntPush(pVVar6,pFanins[(int)pSVar1[iObj].pFansB[local_6c + 1]]);
  }
  if (pMVar4 == p->pCells) {
    p_local._4_4_ = 1;
  }
  else {
    pMVar5 = Mio_LibraryReadGateByName(pLib_00,pMVar4->pName,(char *)0x0);
    if (pMVar5 != (Mio_Gate_t *)pMVar4->pMioGate) {
      __assert_fail("pGate == pCellT->pMioGate",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                    ,0x2d6,
                    "int Sfm_LibImplementGatesArea(Sfm_Lib_t *, int *, int, int, Vec_Int_t *, Vec_Wec_t *)"
                   );
    }
    iVar2 = Mio_GateReadValue(pMVar5);
    Vec_IntPush(vGates,iVar2);
    pVVar6 = Vec_WecPushLevel(vFanins);
    for (local_6c = 0; local_6c < (int)(*(uint *)&pMVar4->field_0x10 >> 0x1c);
        local_6c = local_6c + 1) {
      if (pSVar1[iObj].pFansT[local_6c + 1] == '\x10') {
        iVar2 = Vec_WecSize(vFanins);
        Vec_IntPush(pVVar6,iVar2 + -2);
      }
      else {
        Vec_IntPush(pVVar6,pFanins[(int)pSVar1[iObj].pFansT[local_6c + 1]]);
      }
    }
    p_local._4_4_ = 2;
  }
  return p_local._4_4_;
}

Assistant:

int Sfm_LibImplementGatesArea( Sfm_Lib_t * p, int * pFanins, int nFanins, int iObj, Vec_Int_t * vGates, Vec_Wec_t * vFanins )
{
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    Sfm_Fun_t * pObjMin = p->pObjs + iObj;
    Mio_Cell2_t * pCellB, * pCellT;
    Mio_Gate_t * pGate;
    Vec_Int_t * vLevel;
    int i;
    // get the gates
    pCellB = p->pCells + (int)pObjMin->pFansB[0];
    pCellT = p->pCells + (int)pObjMin->pFansT[0];
    // create bottom gate
    pGate = Mio_LibraryReadGateByName( pLib, pCellB->pName, NULL );
    assert( pGate == pCellB->pMioGate );
    Vec_IntPush( vGates, Mio_GateReadValue(pGate) );
    vLevel = Vec_WecPushLevel( vFanins );
    for ( i = 0; i < (int)pCellB->nFanins; i++ )
        Vec_IntPush( vLevel, pFanins[(int)pObjMin->pFansB[i+1]] );
    if ( pCellT == p->pCells )
        return 1;
    // create top gate
    pGate = Mio_LibraryReadGateByName( pLib, pCellT->pName, NULL );
    assert( pGate == pCellT->pMioGate );
    Vec_IntPush( vGates, Mio_GateReadValue(pGate) );
    vLevel = Vec_WecPushLevel( vFanins );
    for ( i = 0; i < (int)pCellT->nFanins; i++ )
        if ( pObjMin->pFansT[i+1] == (char)16 )
            Vec_IntPush( vLevel, Vec_WecSize(vFanins)-2 );
        else
            Vec_IntPush( vLevel, pFanins[(int)pObjMin->pFansT[i+1]] );
    return 2;
}